

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionReturnType
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  Node *this_00;
  bool bVar1;
  OutputStream S;
  OutputStream local_38;
  
  bVar1 = isFunction(this);
  if (bVar1) {
    local_38.CurrentPackIndex = 0xffffffff;
    local_38.CurrentPackMax = 0xffffffff;
    bVar1 = anon_unknown.dwarf_2c8643::initializeOutputStream(Buf,N,&local_38,0x80);
    if (!bVar1) {
      this_00 = *(Node **)((long)this->RootNode + 0x10);
      if (this_00 != (Node *)0x0) {
        anon_unknown.dwarf_2c8643::Node::print(this_00,&local_38);
      }
      OutputStream::operator+=(&local_38,'\0');
      if (N == (size_t *)0x0) {
        return local_38.Buffer;
      }
      *N = local_38.CurrentPosition;
      return local_38.Buffer;
    }
  }
  return (char *)0x0;
}

Assistant:

char *ItaniumPartialDemangler::getFunctionReturnType(
    char *Buf, size_t *N) const {
  if (!isFunction())
    return nullptr;

  OutputStream S;
  if (initializeOutputStream(Buf, N, S, 128))
    return nullptr;

  if (Node *Ret = static_cast<FunctionEncoding *>(RootNode)->getReturnType())
    Ret->print(S);

  S += '\0';
  if (N != nullptr)
    *N = S.getCurrentPosition();
  return S.getBuffer();
}